

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O2

Object<(anonymous_namespace)::CMakeVersion> * __thiscall
cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
Object<(anonymous_namespace)::CMakeVersion>::
Bind<(anonymous_namespace)::CMakeVersion,unsigned_int,std::function<cmCMakePresetsGraph::ReadFileResult(unsigned_int&,Json::Value_const*)>>
          (Object<(anonymous_namespace)::CMakeVersion> *this,string_view *name,
          offset_in_CMakeVersion_to_unsigned_int member,
          function<cmCMakePresetsGraph::ReadFileResult_(unsigned_int_&,_const_Json::Value_*)> *func,
          bool required)

{
  pointer *ppMVar1;
  undefined8 *puVar2;
  pointer this_00;
  code *pcVar3;
  ulong uVar4;
  pointer __result;
  pointer pMVar5;
  pointer pMVar6;
  ulong uVar7;
  _Tp_alloc_type *__alloc;
  _Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member>_>
  *this_01;
  long lVar8;
  _Any_data local_e8;
  undefined8 local_d8;
  undefined8 uStack_d0;
  pointer local_c8;
  _Any_data local_c0;
  long local_b0;
  undefined8 uStack_a8;
  offset_in_CMakeVersion_to_unsigned_int local_a0;
  size_t local_98;
  char *pcStack_90;
  _Any_data local_88;
  code *local_78;
  code *pcStack_70;
  undefined1 local_68;
  _Any_data local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  
  std::function<cmCMakePresetsGraph::ReadFileResult_(unsigned_int_&,_const_Json::Value_*)>::function
            ((function<cmCMakePresetsGraph::ReadFileResult_(unsigned_int_&,_const_Json::Value_*)> *)
             &local_c0,func);
  local_e8._M_unused._M_object = (void *)0x0;
  local_e8._8_8_ = 0;
  local_d8 = 0;
  uStack_d0 = 0;
  local_a0 = member;
  local_e8._M_unused._M_object = operator_new(0x28);
  *(undefined8 *)local_e8._M_unused._0_8_ = 0;
  *(undefined8 *)((long)local_e8._M_unused._0_8_ + 8) = 0;
  *(undefined8 *)((long)local_e8._M_unused._0_8_ + 0x10) = 0;
  *(undefined8 *)((long)local_e8._M_unused._0_8_ + 0x18) = uStack_a8;
  if (local_b0 != 0) {
    *(void **)local_e8._M_unused._0_8_ = local_c0._M_unused._M_object;
    *(undefined8 *)((long)local_e8._M_unused._0_8_ + 8) = local_c0._8_8_;
    *(long *)((long)local_e8._M_unused._0_8_ + 0x10) = local_b0;
    local_b0 = 0;
    uStack_a8 = 0;
  }
  *(offset_in_CMakeVersion_to_unsigned_int *)((long)local_e8._M_unused._0_8_ + 0x20) = member;
  local_98 = name->_M_len;
  pcStack_90 = name->_M_str;
  local_d8 = 0;
  uStack_d0 = 0;
  local_88._8_8_ = local_e8._8_8_;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_78 = std::
             _Function_handler<cmCMakePresetsGraph::ReadFileResult_((anonymous_namespace)::CMakeVersion_&,_const_Json::Value_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmJSONHelpers.h:40:32)>
             ::_M_manager;
  pcStack_70 = std::
               _Function_handler<cmCMakePresetsGraph::ReadFileResult_((anonymous_namespace)::CMakeVersion_&,_const_Json::Value_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmJSONHelpers.h:40:32)>
               ::_M_invoke;
  local_88._M_unused._0_8_ = local_e8._M_unused._M_object;
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  local_68 = 0;
  pMVar6 = (this->Members).
           super__Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pMVar6 == (this->Members).
                super__Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_c8 = (this->Members).
               super__Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member>_>
               ._M_impl.super__Vector_impl_data._M_start;
    lVar8 = (long)pMVar6 - (long)local_c8;
    if (lVar8 == 0x7ffffffffffffff8) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar4 = lVar8 / 0x38;
    uVar7 = 1;
    if (pMVar6 != local_c8) {
      uVar7 = uVar4;
    }
    this_01 = (_Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member>_>
               *)(uVar7 + uVar4);
    if ((_Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member>_>
         *)0x249249249249248 < this_01) {
      this_01 = (_Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member>_>
                 *)0x249249249249249;
    }
    if (CARRY8(uVar7,uVar4)) {
      this_01 = (_Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member>_>
                 *)0x249249249249249;
    }
    __result = std::
               _Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member>_>
               ::_M_allocate(this_01,0x38);
    pcVar3 = local_78;
    this_00 = local_c8;
    *(size_t *)((long)__result + lVar8) = local_98;
    ((size_t *)((long)__result + lVar8))[1] = (size_t)pcStack_90;
    puVar2 = (undefined8 *)((long)__result + lVar8 + 0x10);
    *puVar2 = 0;
    puVar2[1] = 0;
    *(undefined8 *)((long)__result + lVar8 + 0x20) = 0;
    *(code **)((long)__result + lVar8 + 0x28) = pcStack_70;
    if (local_78 != (code *)0x0) {
      *(void **)((long)__result + lVar8 + 0x10) = local_88._M_unused._M_object;
      *(undefined8 *)((long)__result + lVar8 + 0x18) = local_88._8_8_;
      *(code **)((long)__result + lVar8 + 0x20) = local_78;
      local_78 = (code *)0x0;
      pcStack_70 = (code *)0x0;
    }
    __alloc = (_Tp_alloc_type *)CONCAT71((int7)((ulong)pcVar3 >> 8),local_68);
    *(undefined1 *)((long)__result + lVar8 + 0x30) = local_68;
    pMVar5 = std::
             vector<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member>_>
             ::_S_relocate(local_c8,pMVar6,__result,__alloc);
    pMVar6 = std::
             vector<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member>_>
             ::_S_relocate(pMVar6,pMVar6,pMVar5 + 1,__alloc);
    lVar8 = (long)(this->Members).
                  super__Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)this_00;
    std::
    _Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member>_>
    ::_M_deallocate((_Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member>_>
                     *)this_00,(pointer)(lVar8 / 0x38),lVar8 % 0x38);
    (this->Members).
    super__Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member>_>
    ._M_impl.super__Vector_impl_data._M_start = __result;
    (this->Members).
    super__Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member>_>
    ._M_impl.super__Vector_impl_data._M_finish = pMVar6;
    (this->Members).
    super__Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = __result + (long)this_01;
  }
  else {
    (pMVar6->Name)._M_len = local_98;
    (pMVar6->Name)._M_str = pcStack_90;
    (pMVar6->Function)._M_invoker =
         std::
         _Function_handler<cmCMakePresetsGraph::ReadFileResult_((anonymous_namespace)::CMakeVersion_&,_const_Json::Value_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmJSONHelpers.h:40:32)>
         ::_M_invoke;
    *(void **)&(pMVar6->Function).super__Function_base._M_functor = local_88._M_unused._M_object;
    *(undefined8 *)((long)&(pMVar6->Function).super__Function_base._M_functor + 8) = local_88._8_8_;
    (pMVar6->Function).super__Function_base._M_manager =
         std::
         _Function_handler<cmCMakePresetsGraph::ReadFileResult_((anonymous_namespace)::CMakeVersion_&,_const_Json::Value_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmJSONHelpers.h:40:32)>
         ::_M_manager;
    local_78 = (code *)0x0;
    pcStack_70 = (code *)0x0;
    pMVar6->Required = false;
    ppMVar1 = &(this->Members).
               super__Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::CMakeVersion>::Member>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppMVar1 = *ppMVar1 + 1;
  }
  std::_Function_base::~_Function_base((_Function_base *)&local_88);
  std::_Function_base::~_Function_base((_Function_base *)&local_e8);
  std::_Function_base::~_Function_base((_Function_base *)&local_c0);
  return this;
}

Assistant:

Object& Bind(const cm::string_view& name, M U::*member, F func,
                 bool required = true)
    {
      return this->BindPrivate(name,
                               [func, member](T& out, const Json::Value* value,
                                              CallState&&... state) -> E {
                                 return func(out.*member, value,
                                             std::forward(state)...);
                               },
                               required);
    }